

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

StringEnumeration * icu_63::Transliterator::getAvailableIDs(UErrorCode *ec)

{
  UBool UVar1;
  StringEnumeration *pSVar2;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63(&registryMutex);
    if ((registry == (TransliteratorRegistry *)0x0) &&
       (UVar1 = initializeRegistry(ec), UVar1 == '\0')) {
      pSVar2 = (StringEnumeration *)0x0;
    }
    else {
      pSVar2 = TransliteratorRegistry::getAvailableIDs(registry);
    }
    umtx_unlock_63(&registryMutex);
    if (pSVar2 != (StringEnumeration *)0x0) {
      return pSVar2;
    }
    *ec = U_INTERNAL_TRANSLITERATOR_ERROR;
  }
  return (StringEnumeration *)0x0;
}

Assistant:

void Transliterator::setMaximumContextLength(int32_t maxContextLength) {
    maximumContextLength = maxContextLength;
}